

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<capnp::TwoPartyServer::AcceptedConnection> __thiscall
kj::
heap<capnp::TwoPartyServer::AcceptedConnection,capnp::Capability::Client&,kj::Own<kj::AsyncIoStream>>
          (kj *this,Client *params,Own<kj::AsyncIoStream> *params_1)

{
  AcceptedConnection *this_00;
  Client *other;
  Own<kj::AsyncIoStream> *connectionParam;
  AcceptedConnection *extraout_RDX;
  Own<capnp::TwoPartyServer::AcceptedConnection> OVar1;
  Client local_30;
  Own<kj::AsyncIoStream> *local_20;
  Own<kj::AsyncIoStream> *params_local_1;
  Client *params_local;
  
  local_20 = params_1;
  params_local_1 = (Own<kj::AsyncIoStream> *)params;
  params_local = (Client *)this;
  this_00 = (AcceptedConnection *)operator_new(0x1a0);
  other = fwd<capnp::Capability::Client&>((Client *)params_local_1);
  capnp::Capability::Client::Client(&local_30,other);
  connectionParam = fwd<kj::Own<kj::AsyncIoStream>>(local_20);
  capnp::TwoPartyServer::AcceptedConnection::AcceptedConnection(this_00,&local_30,connectionParam);
  Own<capnp::TwoPartyServer::AcceptedConnection>::Own
            ((Own<capnp::TwoPartyServer::AcceptedConnection> *)this,this_00,
             (Disposer *)&_::HeapDisposer<capnp::TwoPartyServer::AcceptedConnection>::instance);
  capnp::Capability::Client::~Client(&local_30);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}